

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

void scroll_into_view(Am_Object *cls)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  ushort uVar6;
  int scroller_y_offset;
  int scroller_bottom;
  int scroller_height;
  int scroller_top;
  int cls_bottom;
  int cls_height;
  Am_Object local_28;
  Am_Object local_20;
  int local_18;
  int local_14;
  int cls_top;
  int cls_left;
  Am_Object *cls_local;
  
  uVar6 = (ushort)cls;
  _cls_top = cls;
  pAVar5 = (Am_Value *)Am_Object::Get(uVar6,100);
  local_14 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = (Am_Value *)Am_Object::Get(uVar6,0x65);
  local_18 = Am_Value::operator_cast_to_int(pAVar5);
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)cls);
  iVar2 = local_14;
  iVar1 = local_18;
  Am_Object::Get_Owner(&local_28,0x115508);
  Am_Translate_Coordinates
            ((Am_Object *)&local_20,iVar2,iVar1,(Am_Object *)&local_28,&local_14,&local_18);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&local_20);
  pAVar5 = (Am_Value *)Am_Object::Get(uVar6,0x67);
  iVar1 = Am_Value::operator_cast_to_int(pAVar5);
  iVar1 = local_18 + iVar1;
  pAVar5 = (Am_Value *)Am_Object::Get(0x5508,0x65);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = (Am_Value *)Am_Object::Get(0x5508,0x67);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = (Am_Value *)Am_Object::Get(0x5508,0x11e);
  iVar4 = Am_Value::operator_cast_to_int(pAVar5);
  if (local_18 < iVar2) {
    Am_Object::Set(0x5508,0x11e,(ulong)(uint)(iVar4 - (iVar2 - local_18)));
  }
  else if (iVar2 + iVar3 < iVar1) {
    Am_Object::Set(0x5508,0x11e,(ulong)(uint)(iVar4 + (iVar1 - (iVar2 + iVar3))));
  }
  return;
}

Assistant:

void
scroll_into_view(Am_Object cls)
{
  int cls_left = cls.Get(Am_LEFT);
  int cls_top = cls.Get(Am_TOP);
  Am_Translate_Coordinates(cls.Get_Owner(), cls_left, cls_top,
                           class_scroller.Get_Owner(), cls_left, cls_top);

  int cls_height = cls.Get(Am_HEIGHT);
  int cls_bottom = cls_top + cls_height;

  int scroller_top = class_scroller.Get(Am_TOP);
  int scroller_height = class_scroller.Get(Am_HEIGHT);
  int scroller_bottom = scroller_top + scroller_height;

  int scroller_y_offset = class_scroller.Get(Am_Y_OFFSET);

  if (cls_top < scroller_top)
    class_scroller.Set(Am_Y_OFFSET,
                       scroller_y_offset - (scroller_top - cls_top));
  else if (cls_bottom > scroller_bottom)
    class_scroller.Set(Am_Y_OFFSET,
                       scroller_y_offset + (cls_bottom - scroller_bottom));
}